

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracking_ptr.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::enable_reference_tracking
          (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *that)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->refs_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->refs_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->refs_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->refs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->refs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->refs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->deps_)._M_t._M_impl.super__Rb_tree_header;
  (this->refs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->deps_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->deps_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->self_).px = (element_type *)0x0;
  *(undefined8 *)((long)&(this->self_).px + 4) = 0;
  *(undefined8 *)((long)&(this->self_).pn.pi_ + 4) = 0;
  operator=(this,that);
  return;
}

Assistant:

enable_reference_tracking(enable_reference_tracking<Derived> const &that)
      : refs_()
      , deps_()
      , self_()
      , cnt_(0)
    {
        this->operator =(that);
    }